

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbgfx_test.cpp
# Opt level: O1

void __thiscall Png::~Png(Png *this)

{
  pointer pRVar1;
  
  png_destroy_read_struct(&this->png,&this->info,0);
  pRVar1 = (this->pixels).
           super__Vector_base<Rgba,_default_init_allocator<Rgba,_std::allocator<Rgba>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pRVar1 != (pointer)0x0) {
    operator_delete(pRVar1,(long)(this->pixels).
                                 super__Vector_base<Rgba,_default_init_allocator<Rgba,_std::allocator<Rgba>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pRVar1);
  }
  std::filebuf::~filebuf(&this->file);
  return;
}

Assistant:

~Png() { png_destroy_read_struct(&png, &info, nullptr); }